

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::SegmentInfo::Write(SegmentInfo *this,IMkvWriter *writer)

{
  bool bVar1;
  uint64 uVar2;
  uint64 uVar3;
  IMkvWriter *writer_00;
  double dVar4;
  long lVar5;
  long *in_RSI;
  double *in_RDI;
  int64_t stop_position;
  int64_t payload_position;
  uint64_t size;
  IMkvWriter *in_stack_ffffffffffffffd0;
  IMkvWriter *in_stack_ffffffffffffffd8;
  uint64 local_20;
  bool local_1;
  
  if (((in_RSI == (long *)0x0) || (in_RDI[1] == 0.0)) || (in_RDI[3] == 0.0)) {
    local_1 = false;
  }
  else {
    local_20 = EbmlElementSize((uint64)in_stack_ffffffffffffffd0,(uint64)in_RDI);
    if (0.0 < *in_RDI) {
      uVar2 = EbmlElementSize((uint64)in_stack_ffffffffffffffd0,(float)((ulong)in_RDI >> 0x20));
      local_20 = uVar2 + local_20;
    }
    if (in_RDI[4] != -0.0) {
      uVar2 = EbmlDateElementSize((uint64)in_stack_ffffffffffffffd0);
      local_20 = uVar2 + local_20;
    }
    uVar2 = EbmlElementSize((uint64)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0);
    uVar3 = EbmlElementSize((uint64)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0);
    bVar1 = WriteEbmlMasterElement
                      (in_stack_ffffffffffffffd8,(uint64)in_stack_ffffffffffffffd0,(uint64)in_RDI);
    if (bVar1) {
      writer_00 = (IMkvWriter *)(**(code **)(*in_RSI + 8))();
      if ((long)writer_00 < 0) {
        local_1 = false;
      }
      else {
        bVar1 = WriteEbmlElement(in_stack_ffffffffffffffd0,(uint64)in_RDI,0x17a008);
        if (bVar1) {
          if (0.0 < *in_RDI) {
            dVar4 = (double)(**(code **)(*in_RSI + 8))();
            in_RDI[5] = dVar4;
            bVar1 = WriteEbmlElement(writer_00,(uint64)in_stack_ffffffffffffffd0,
                                     (float)((ulong)in_RDI >> 0x20));
            if (!bVar1) {
              return false;
            }
          }
          if (in_RDI[4] != -0.0) {
            WriteEbmlDateElement(writer_00,(uint64)in_stack_ffffffffffffffd0,(int64)in_RDI);
          }
          bVar1 = WriteEbmlElement(writer_00,(uint64)in_stack_ffffffffffffffd0,(char *)in_RDI);
          if (bVar1) {
            bVar1 = WriteEbmlElement(writer_00,(uint64)in_stack_ffffffffffffffd0,(char *)in_RDI);
            if (bVar1) {
              lVar5 = (**(code **)(*in_RSI + 8))();
              if ((lVar5 < 0) || (lVar5 - (long)writer_00 != uVar3 + uVar2 + local_20)) {
                local_1 = false;
              }
              else {
                local_1 = true;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SegmentInfo::Write(IMkvWriter* writer) {
  if (!writer || !muxing_app_ || !writing_app_)
    return false;

  uint64_t size = EbmlElementSize(libwebm::kMkvTimecodeScale,
                                  static_cast<uint64>(timecode_scale_));
  if (duration_ > 0.0)
    size +=
        EbmlElementSize(libwebm::kMkvDuration, static_cast<float>(duration_));
  if (date_utc_ != INT64_MIN)
    size += EbmlDateElementSize(libwebm::kMkvDateUTC);
  size += EbmlElementSize(libwebm::kMkvMuxingApp, muxing_app_);
  size += EbmlElementSize(libwebm::kMkvWritingApp, writing_app_);

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvInfo, size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvTimecodeScale,
                        static_cast<uint64>(timecode_scale_)))
    return false;

  if (duration_ > 0.0) {
    // Save for later
    duration_pos_ = writer->Position();

    if (!WriteEbmlElement(writer, libwebm::kMkvDuration,
                          static_cast<float>(duration_)))
      return false;
  }

  if (date_utc_ != INT64_MIN)
    WriteEbmlDateElement(writer, libwebm::kMkvDateUTC, date_utc_);

  if (!WriteEbmlElement(writer, libwebm::kMkvMuxingApp, muxing_app_))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvWritingApp, writing_app_))
    return false;

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  return true;
}